

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_layout_widget_space(nk_rect *bounds,nk_context *ctx,nk_window *win,int modify)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  nk_panel_type type;
  int iVar7;
  uint uVar8;
  int iVar9;
  nk_panel *pnVar10;
  float *pfVar11;
  nk_vec2 nVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float local_48;
  
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x465d,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  pnVar10 = ctx->current->layout;
  if (pnVar10 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x465e,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  if (bounds == (nk_rect *)0x0) {
    __assert_fail("bounds",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x4665,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar17 = (ctx->style).window.spacing.x;
  fVar15 = (ctx->style).window.spacing.y;
  type = pnVar10->type;
  nVar12 = nk_panel_get_padding(&ctx->style,type);
  fVar16 = (pnVar10->bounds).w;
  iVar7 = (pnVar10->row).columns;
  fVar14 = nk_layout_row_calculate_usable_space(&ctx->style,type,fVar16,iVar7);
  iVar13 = (int)win;
  switch((pnVar10->row).type) {
  case NK_LAYOUT_DYNAMIC_FIXED:
    if (fVar14 <= 1.0) {
      fVar14 = 1.0;
    }
    fVar14 = fVar14 / (float)iVar7;
    goto LAB_0014086b;
  case NK_LAYOUT_DYNAMIC_ROW:
    fVar18 = (pnVar10->row).item_width;
    fVar16 = (pnVar10->row).item_offset;
    fVar14 = fVar14 * fVar18;
    fVar19 = 0.0;
    if (iVar13 != 0) {
      (pnVar10->row).item_offset = fVar17 + fVar14 + fVar16;
      (pnVar10->row).filled = (pnVar10->row).filled + fVar18;
      (pnVar10->row).index = 0;
    }
    goto LAB_00140ab7;
  case NK_LAYOUT_DYNAMIC_FREE:
    uVar1 = pnVar10->at_x;
    uVar4 = pnVar10->at_y;
    uVar2 = (pnVar10->row).item.x;
    uVar5 = (pnVar10->row).item.y;
    fVar17 = (pnVar10->row).height;
    uVar8 = *pnVar10->offset_y;
    uVar3 = (pnVar10->row).item.w;
    uVar6 = (pnVar10->row).item.h;
    bounds->x = (fVar16 * (float)uVar2 + (float)uVar1) - (float)*pnVar10->offset_x;
    bounds->y = (fVar17 * (float)uVar5 + (float)uVar4) - (float)uVar8;
    bounds->w = (float)uVar3 * fVar16;
    bounds->h = (float)uVar6 * fVar17;
    return;
  case NK_LAYOUT_DYNAMIC:
    pfVar11 = (pnVar10->row).ratio;
    if (pfVar11 == (float *)0x0) {
      __assert_fail("layout->row.ratio",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x468d,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    iVar7 = (pnVar10->row).index;
    fVar18 = pfVar11[iVar7];
    if (fVar18 < 0.0) {
      fVar18 = (pnVar10->row).item_width;
    }
    fVar19 = fVar17 * (float)iVar7;
    fVar14 = fVar14 * fVar18;
    fVar16 = (pnVar10->row).item_offset;
    if (iVar13 != 0) {
      (pnVar10->row).item_offset = fVar14 + fVar16;
      (pnVar10->row).filled = (pnVar10->row).filled + fVar18;
    }
    goto LAB_00140ab7;
  case NK_LAYOUT_STATIC_FIXED:
    fVar14 = (pnVar10->row).item_width;
LAB_0014086b:
    fVar19 = (float)(pnVar10->row).index;
    fVar16 = fVar14 * fVar19;
    fVar19 = fVar17 * fVar19;
    goto LAB_00140ab7;
  case NK_LAYOUT_STATIC_ROW:
    iVar9 = (pnVar10->row).index;
    fVar14 = (pnVar10->row).item_width;
    fVar16 = (pnVar10->row).item_offset;
    break;
  case NK_LAYOUT_STATIC_FREE:
    fVar17 = (pnVar10->row).item.w;
    fVar15 = pnVar10->at_x + (pnVar10->row).item.x;
    bounds->w = fVar17;
    if ((iVar13 != 0) &&
       (fVar17 = fVar17 + fVar15, pnVar10->max_x <= fVar17 && fVar17 != pnVar10->max_x)) {
      pnVar10->max_x = fVar17;
    }
    bounds->x = fVar15 - (float)*pnVar10->offset_x;
    bounds->y = (pnVar10->at_y + (pnVar10->row).item.y) - (float)*pnVar10->offset_y;
    bounds->h = (pnVar10->row).item.h;
    return;
  case NK_LAYOUT_STATIC:
    iVar9 = (pnVar10->row).index;
    fVar14 = (pnVar10->row).ratio[iVar9];
    fVar16 = (pnVar10->row).item_offset;
    break;
  case NK_LAYOUT_TEMPLATE:
    iVar9 = (pnVar10->row).index;
    if (iVar7 <= iVar9) {
      __assert_fail("layout->row.index < layout->row.columns",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x46bc,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    if (0xf < iVar9) {
      __assert_fail("layout->row.index < 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                    ,0x46bd,
                    "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                   );
    }
    fVar14 = (pnVar10->row).templates[iVar9];
    fVar16 = (pnVar10->row).item_offset;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x46c3,
                  "void nk_layout_widget_space(struct nk_rect *, const struct nk_context *, struct nk_window *, int)"
                 );
  }
  fVar19 = fVar17 * (float)iVar9;
  if (iVar13 != 0) {
    (pnVar10->row).item_offset = fVar14 + fVar16;
  }
LAB_00140ab7:
  bounds->w = fVar14;
  bounds->h = (pnVar10->row).height - fVar15;
  bounds->y = pnVar10->at_y - (float)*pnVar10->offset_y;
  local_48 = nVar12.x;
  local_48 = fVar16 + pnVar10->at_x + fVar19 + local_48;
  if ((iVar13 != 0) &&
     (fVar14 = fVar14 + local_48, pnVar10->max_x <= fVar14 && fVar14 != pnVar10->max_x)) {
    pnVar10->max_x = fVar14;
  }
  bounds->x = local_48 - (float)*pnVar10->offset_x;
  return;
}

Assistant:

NK_LIB void
nk_layout_widget_space(struct nk_rect *bounds, const struct nk_context *ctx,
    struct nk_window *win, int modify)
{
    struct nk_panel *layout;
    const struct nk_style *style;

    struct nk_vec2 spacing;
    struct nk_vec2 padding;

    float item_offset = 0;
    float item_width = 0;
    float item_spacing = 0;
    float panel_space = 0;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    style = &ctx->style;
    NK_ASSERT(bounds);

    spacing = style->window.spacing;
    padding = nk_panel_get_padding(style, layout->type);
    panel_space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                                            layout->bounds.w, layout->row.columns);

    /* calculate the width of one item inside the current layout space */
    switch (layout->row.type) {
    case NK_LAYOUT_DYNAMIC_FIXED: {
        /* scaling fixed size widgets item width */
        item_width = NK_MAX(1.0f,panel_space) / (float)layout->row.columns;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_DYNAMIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width * panel_space;
        item_offset = layout->row.item_offset;
        item_spacing = 0;

        if (modify) {
            layout->row.item_offset += item_width + spacing.x;
            layout->row.filled += layout->row.item_width;
            layout->row.index = 0;
        }
    } break;
    case NK_LAYOUT_DYNAMIC_FREE: {
        /* panel width depended free widget placing */
        bounds->x = layout->at_x + (layout->bounds.w * layout->row.item.x);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + (layout->row.height * layout->row.item.y);
        bounds->y -= (float)*layout->offset_y;
        bounds->w = layout->bounds.w  * layout->row.item.w;
        bounds->h = layout->row.height * layout->row.item.h;
        return;
    }
    case NK_LAYOUT_DYNAMIC: {
        /* scaling arrays of panel width ratios for every widget */
        float ratio;
        NK_ASSERT(layout->row.ratio);
        ratio = (layout->row.ratio[layout->row.index] < 0) ?
            layout->row.item_width : layout->row.ratio[layout->row.index];

        item_spacing = (float)layout->row.index * spacing.x;
        item_width = (ratio * panel_space);
        item_offset = layout->row.item_offset;

        if (modify) {
            layout->row.item_offset += item_width;
            layout->row.filled += ratio;
        }
    } break;
    case NK_LAYOUT_STATIC_FIXED: {
        /* non-scaling fixed widgets item width */
        item_width = layout->row.item_width;
        item_offset = (float)layout->row.index * item_width;
        item_spacing = (float)layout->row.index * spacing.x;
    } break;
    case NK_LAYOUT_STATIC_ROW: {
        /* scaling single ratio widget width */
        item_width = layout->row.item_width;
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_STATIC_FREE: {
        /* free widget placing */
        bounds->x = layout->at_x + layout->row.item.x;
        bounds->w = layout->row.item.w;
        if (((bounds->x + bounds->w) > layout->max_x) && modify)
            layout->max_x = (bounds->x + bounds->w);
        bounds->x -= (float)*layout->offset_x;
        bounds->y = layout->at_y + layout->row.item.y;
        bounds->y -= (float)*layout->offset_y;
        bounds->h = layout->row.item.h;
        return;
    }
    case NK_LAYOUT_STATIC: {
        /* non-scaling array of panel pixel width for every widget */
        item_spacing = (float)layout->row.index * spacing.x;
        item_width = layout->row.ratio[layout->row.index];
        item_offset = layout->row.item_offset;
        if (modify) layout->row.item_offset += item_width;
    } break;
    case NK_LAYOUT_TEMPLATE: {
        /* stretchy row layout with combined dynamic/static widget width*/
        NK_ASSERT(layout->row.index < layout->row.columns);
        NK_ASSERT(layout->row.index < NK_MAX_LAYOUT_ROW_TEMPLATE_COLUMNS);
        item_width = layout->row.templates[layout->row.index];
        item_offset = layout->row.item_offset;
        item_spacing = (float)layout->row.index * spacing.x;
        if (modify) layout->row.item_offset += item_width;
    } break;
    default: NK_ASSERT(0); break;
    };

    /* set the bounds of the newly allocated widget */
    bounds->w = item_width;
    bounds->h = layout->row.height - spacing.y;
    bounds->y = layout->at_y - (float)*layout->offset_y;
    bounds->x = layout->at_x + item_offset + item_spacing + padding.x;
    if (((bounds->x + bounds->w) > layout->max_x) && modify)
        layout->max_x = bounds->x + bounds->w;
    bounds->x -= (float)*layout->offset_x;
}